

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_t * ptls_server_new(ptls_context_t *ctx)

{
  ptls_t *ppVar1;
  
  ppVar1 = new_instance(ctx,1);
  ppVar1->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar1->field_19).server.early_data_skipped_bytes = 0xffffffff;
  if (ptls_server_new::logpoint.state.generation != ptls_log._generation) {
    ptls_server_new_cold_1();
  }
  if (ptls_server_new::logpoint.state.active_conns != 0) {
    ptls_server_new_cold_2();
  }
  return ppVar1;
}

Assistant:

ptls_t *ptls_server_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 1);
    tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    tls->server.early_data_skipped_bytes = UINT32_MAX;

    PTLS_PROBE(NEW, tls, 1);
    PTLS_LOG_CONN(new, tls, { PTLS_LOG_ELEMENT_BOOL(is_server, 1); });
    return tls;
}